

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.cpp
# Opt level: O0

QDataStream * operator>>(QDataStream *in,QBitArray *ba)

{
  char cVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  qsizetype qVar6;
  longlong *plVar7;
  qint64 qVar8;
  char *pcVar9;
  QByteArray *pQVar10;
  QByteArray *in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  char fromStream;
  qsizetype blockSize;
  qsizetype allocated;
  qsizetype totalBytes;
  qsizetype len;
  qsizetype Step;
  quint64 tmp_1;
  quint32 tmp;
  quint64 *in_stack_ffffffffffffff78;
  QDataStream *in_stack_ffffffffffffff80;
  QDataStream *in_stack_ffffffffffffff88;
  QByteArray *in_stack_ffffffffffffff90;
  long local_58;
  QByteArray *local_48;
  long local_28;
  longlong local_20;
  QByteArray *local_18;
  uint local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QBitArray::clear((QBitArray *)0x589260);
  iVar4 = QDataStream::version(in_RDI);
  if (iVar4 < 0x14) {
    local_c = 0xaaaaaaaa;
    QDataStream::operator>>(in_stack_ffffffffffffff80,(quint32 *)in_stack_ffffffffffffff78);
    uVar3 = local_c;
    uVar5 = std::numeric_limits<int>::max();
    if (uVar5 < uVar3) {
      QDataStream::setStatus(in_RDI,ReadCorruptData);
      goto LAB_005894cf;
    }
    local_48 = (QByteArray *)(ulong)local_c;
  }
  else {
    local_18 = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
    QDataStream::operator>>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    in_stack_ffffffffffffff90 = local_18;
    pQVar10 = (QByteArray *)std::numeric_limits<long_long>::max();
    if (pQVar10 < in_stack_ffffffffffffff90) {
      QDataStream::setStatus(in_RDI,SizeLimitExceeded);
      goto LAB_005894cf;
    }
    local_48 = local_18;
  }
  if (local_48 == (QByteArray *)0x0) {
    QBitArray::clear((QBitArray *)0x58935f);
  }
  else {
    local_20 = 0x800000;
    qVar6 = storage_size((qsizetype)local_48);
    for (local_58 = 0; local_58 < qVar6; local_58 = lVar2 + local_58) {
      local_28 = qVar6 - local_58;
      plVar7 = qMin<long_long>(&local_20,&local_28);
      lVar2 = *plVar7;
      QByteArray::resize(in_stack_ffffffffffffff90,(qsizetype)in_stack_ffffffffffffff88);
      in_stack_ffffffffffffff88 = in_RDI;
      QByteArray::data((QByteArray *)in_stack_ffffffffffffff80);
      qVar8 = QDataStream::readRawData
                        (in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,
                         (qint64)in_stack_ffffffffffffff78);
      if (qVar8 != lVar2) {
        QBitArray::clear((QBitArray *)0x58941d);
        QDataStream::setStatus(in_RDI,ReadPastEnd);
        goto LAB_005894cf;
      }
    }
    pcVar9 = QByteArray::back((QByteArray *)in_stack_ffffffffffffff80);
    cVar1 = *pcVar9;
    pQVar10 = (QByteArray *)QByteArray::data((QByteArray *)in_stack_ffffffffffffff80);
    qVar6 = QByteArray::size(in_RSI);
    adjust_head_and_tail((char *)pQVar10,qVar6,(qsizetype)local_48);
    pcVar9 = QByteArray::back(pQVar10);
    if (*pcVar9 != cVar1) {
      QBitArray::clear((QBitArray *)0x5894aa);
      QDataStream::setStatus(in_RDI,ReadCorruptData);
    }
  }
LAB_005894cf:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QDataStream &operator>>(QDataStream &in, QBitArray &ba)
{
    ba.clear();
    qsizetype len;
    if (in.version() < QDataStream::Qt_6_0) {
        quint32 tmp;
        in >> tmp;
        if (Q_UNLIKELY(tmp > quint32((std::numeric_limits<qint32>::max)()))) {
            in.setStatus(QDataStream::ReadCorruptData);
            return in;
        }
        len = tmp;
    } else {
        quint64 tmp;
        in >> tmp;
        if (Q_UNLIKELY(tmp > quint64((std::numeric_limits<qsizetype>::max)()))) {
            in.setStatus(QDataStream::Status::SizeLimitExceeded);
            return in;
        }
        len = tmp;
    }
    if (len == 0) {
        ba.clear();
        return in;
    }

    const qsizetype Step = 8 * 1024 * 1024;
    const qsizetype totalBytes = storage_size(len);
    qsizetype allocated = 0;

    while (allocated < totalBytes) {
        qsizetype blockSize = qMin(Step, totalBytes - allocated);
        ba.d.resize(allocated + blockSize + 1);
        if (in.readRawData(ba.d.data() + 1 + allocated, blockSize) != blockSize) {
            ba.clear();
            in.setStatus(QDataStream::ReadPastEnd);
            return in;
        }
        allocated += blockSize;
    }

    const auto fromStream = ba.d.back();
    adjust_head_and_tail(ba.d.data(), ba.d.size(), len);
    if (ba.d.back() != fromStream) {
        ba.clear();
        in.setStatus(QDataStream::ReadCorruptData);
        return in;
    }
    return in;
}